

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::InsertName(CodeGenerateVisitor *this,String *name,int register_id)

{
  bool bVar1;
  pointer ppVar2;
  int in_EDX;
  long in_RDI;
  LocalNameInfo local;
  size_t end_pc;
  iterator it;
  size_t begin_pc;
  GenerateBlock *block;
  Function *function;
  unordered_map<luna::String_*,_luna::LocalNameInfo,_std::hash<luna::String_*>,_std::equal_to<luna::String_*>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>_>
  *in_stack_ffffffffffffff58;
  String **in_stack_ffffffffffffff60;
  pair<luna::String_*,_luna::LocalNameInfo> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int end_pc_00;
  int in_stack_ffffffffffffff80;
  uint3 in_stack_ffffffffffffff84;
  uint register_id_00;
  String *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  LocalNameInfo local_58;
  LocalNameInfo local_50;
  size_t local_48;
  _Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false> local_40;
  _Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false> local_38;
  size_t local_30;
  long local_28;
  undefined8 local_20;
  int local_14;
  
  register_id_00 = (uint)in_stack_ffffffffffffff84;
  if (*(long *)(in_RDI + 0x10) != 0) {
    register_id_00 =
         CONCAT13(*(long *)(*(long *)(in_RDI + 0x10) + 8) != 0,in_stack_ffffffffffffff84);
  }
  if ((char)(register_id_00 >> 0x18) == '\0') {
    __assert_fail("current_function_ && current_function_->current_block_",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                  ,0x113,"void luna::CodeGenerateVisitor::InsertName(String *, int)");
  }
  local_20 = *(undefined8 *)(*(long *)(in_RDI + 0x10) + 0x10);
  local_28 = *(long *)(*(long *)(in_RDI + 0x10) + 8);
  local_14 = in_EDX;
  local_30 = Function::OpCodeSize((Function *)0x1b2c5a);
  end_pc_00 = (int)((ulong)in_RDI >> 0x20);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<luna::String_*,_luna::LocalNameInfo,_std::hash<luna::String_*>,_std::equal_to<luna::String_*>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>_>
       ::find(in_stack_ffffffffffffff58,(key_type *)0x1b2c78);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<luna::String_*,_luna::LocalNameInfo,_std::hash<luna::String_*>,_std::equal_to<luna::String_*>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>_>
       ::end(in_stack_ffffffffffffff58);
  bVar1 = std::__detail::operator!=(&local_38,&local_40);
  if (bVar1) {
    local_48 = Function::OpCodeSize((Function *)0x1b2cb8);
    std::__detail::_Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>
    ::operator->((_Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>
                  *)0x1b2ce1);
    std::__detail::_Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>
    ::operator->((_Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>
                  *)0x1b2cf2);
    Function::AddLocalVar
              ((Function *)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,register_id_00,in_stack_ffffffffffffff80,end_pc_00);
    LocalNameInfo::LocalNameInfo(&local_50,local_14,(int)local_30);
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>::
             operator->((_Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>
                         *)0x1b2d32);
    ppVar2->second = local_50;
  }
  else {
    LocalNameInfo::LocalNameInfo(&local_58,local_14,(int)local_30);
    std::make_pair<luna::String*&,luna::LocalNameInfo&>
              (in_stack_ffffffffffffff60,(LocalNameInfo *)(local_28 + 0x10));
    std::
    unordered_map<luna::String*,luna::LocalNameInfo,std::hash<luna::String*>,std::equal_to<luna::String*>,std::allocator<std::pair<luna::String*const,luna::LocalNameInfo>>>
    ::insert<std::pair<luna::String*,luna::LocalNameInfo>>
              ((unordered_map<luna::String_*,_luna::LocalNameInfo,_std::hash<luna::String_*>,_std::equal_to<luna::String_*>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>_>
                *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

void InsertName(String *name, int register_id)
        {
            assert(current_function_ && current_function_->current_block_);

            auto function = current_function_->function_;
            auto block = current_function_->current_block_;
            auto begin_pc = function->OpCodeSize();

            auto it = block->names_.find(name);
            if (it != block->names_.end())
            {
                // Add the same name variable to the function local variable list
                auto end_pc = function->OpCodeSize();
                function->AddLocalVar(name, it->second.register_id_,
                                      it->second.begin_pc_, end_pc);

                // New variable replace the old one
                it->second = LocalNameInfo(register_id, begin_pc);
            }
            else
            {
                // Variable not existed, then insert into
                LocalNameInfo local(register_id, begin_pc);
                block->names_.insert(std::make_pair(name, local));
            }
        }